

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O0

bool __thiscall Unit::setNamesStandard(Unit *this)

{
  bool bVar1;
  ostream *poVar2;
  string local_380 [32];
  string local_360 [48];
  stringstream local_330 [8];
  stringstream name;
  ostream local_320;
  stringstream local_1a8 [8];
  stringstream symbol;
  ostream local_198;
  byte local_19;
  Unit *pUStack_18;
  bool match;
  Unit *this_local;
  
  local_19 = 0;
  pUStack_18 = this;
  if ((this->bInvalid & 1U) == 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__cxx11::stringstream::stringstream(local_330);
    switch(this->nExpPrefix) {
    case 0:
      std::operator<<(&local_198,"");
      std::operator<<(&local_320,"");
      break;
    case 1:
      std::operator<<(&local_198,"da");
      std::operator<<(&local_320,"deca");
      break;
    case 2:
      std::operator<<(&local_198,'h');
      std::operator<<(&local_320,"hecto");
      break;
    case 3:
      std::operator<<(&local_198,'k');
      std::operator<<(&local_320,"kilo");
      break;
    case 6:
      std::operator<<(&local_198,'M');
      std::operator<<(&local_320,"mega");
      break;
    case 9:
      std::operator<<(&local_198,'G');
      std::operator<<(&local_320,"giga");
      break;
    case 0xc:
      std::operator<<(&local_198,'T');
      std::operator<<(&local_320,"tera");
      break;
    case 0xf:
      std::operator<<(&local_198,'P');
      std::operator<<(&local_320,"peta");
      break;
    case 0x12:
      std::operator<<(&local_198,'E');
      std::operator<<(&local_320,"exa");
      break;
    case 0x15:
      std::operator<<(&local_198,'Z');
      std::operator<<(&local_320,"zetta");
      break;
    case 0x18:
      std::operator<<(&local_198,'Y');
      std::operator<<(&local_320,"yotta");
      break;
    case -0x18:
      std::operator<<(&local_198,'y');
      std::operator<<(&local_320,"yocto");
      break;
    default:
      poVar2 = std::operator<<(&local_198,"10^");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->nExpPrefix);
      std::operator<<(poVar2,' ');
      break;
    case -0x15:
      std::operator<<(&local_198,'z');
      std::operator<<(&local_320,"zepto");
      break;
    case -0x12:
      std::operator<<(&local_198,'a');
      std::operator<<(&local_320,"atto");
      break;
    case -0xf:
      std::operator<<(&local_198,'f');
      std::operator<<(&local_320,"femto");
      break;
    case -0xc:
      std::operator<<(&local_198,'p');
      std::operator<<(&local_320,"pico");
      break;
    case -9:
      std::operator<<(&local_198,'n');
      std::operator<<(&local_320,"nano");
      break;
    case -6:
      std::operator<<(&local_198,'u');
      std::operator<<(&local_320,"micro");
      break;
    case -3:
      std::operator<<(&local_198,'m');
      std::operator<<(&local_320,"milli");
      break;
    case -2:
      std::operator<<(&local_198,'c');
      std::operator<<(&local_320,"centi");
      break;
    case -1:
      std::operator<<(&local_198,'d');
      std::operator<<(&local_320,"deci");
    }
    bVar1 = equals(this,0,0,0,0,0,0,0);
    if (bVar1) {
      std::operator<<(&local_198,"");
      std::operator<<(&local_320,"");
      local_19 = 1;
    }
    else {
      bVar1 = equals(this,1,0,0,0,0,0,0);
      if (bVar1) {
        std::operator<<(&local_198,"m");
        std::operator<<(&local_320,"meter");
        local_19 = 1;
      }
      else {
        bVar1 = equals(this,0,1,0,0,0,0,0);
        if (bVar1) {
          std::operator<<(&local_198,"kg");
          std::operator<<(&local_320,"kilogram");
          local_19 = 1;
        }
        else {
          bVar1 = equals(this,0,0,1,0,0,0,0);
          if (bVar1) {
            std::operator<<(&local_198,"s");
            std::operator<<(&local_320,"second");
            local_19 = 1;
          }
          else {
            bVar1 = equals(this,0,0,0,1,0,0,0);
            if (bVar1) {
              std::operator<<(&local_198,"A");
              std::operator<<(&local_320,"ampere");
              local_19 = 1;
            }
            else {
              bVar1 = equals(this,0,0,0,0,1,0,0);
              if (bVar1) {
                std::operator<<(&local_198,"K");
                std::operator<<(&local_320,"kelvin");
                local_19 = 1;
              }
              else {
                bVar1 = equals(this,0,0,0,0,0,1,0);
                if (bVar1) {
                  std::operator<<(&local_198,"mol");
                  std::operator<<(&local_320,"mole");
                  local_19 = 1;
                }
                else {
                  bVar1 = equals(this,0,0,0,0,0,0,1);
                  if (bVar1) {
                    std::operator<<(&local_198,"cd");
                    std::operator<<(&local_320,"candela");
                    local_19 = 1;
                  }
                  else {
                    bVar1 = equals(this,1,1,-2,0,0,0,0);
                    if (bVar1) {
                      std::operator<<(&local_198,'N');
                      std::operator<<(&local_320,"newton");
                      local_19 = 1;
                    }
                    else {
                      bVar1 = equals(this,-1,1,-2,0,0,0,0);
                      if (bVar1) {
                        std::operator<<(&local_198,"Pa");
                        std::operator<<(&local_320,"pascal");
                        local_19 = 1;
                      }
                      else {
                        bVar1 = equals(this,2,1,-2,0,0,0,0);
                        if (bVar1) {
                          std::operator<<(&local_198,'J');
                          std::operator<<(&local_320,"joule");
                          local_19 = 1;
                        }
                        else {
                          bVar1 = equals(this,2,1,-3,0,0,0,0);
                          if (bVar1) {
                            std::operator<<(&local_198,'W');
                            std::operator<<(&local_320,"watt");
                            local_19 = 1;
                          }
                          else {
                            bVar1 = equals(this,0,0,1,1,0,0,0);
                            if (bVar1) {
                              std::operator<<(&local_198,'C');
                              std::operator<<(&local_320,"coulomb");
                              local_19 = 1;
                            }
                            else {
                              bVar1 = equals(this,2,1,-3,-1,0,0,0);
                              if (bVar1) {
                                std::operator<<(&local_198,'V');
                                std::operator<<(&local_320,"volt");
                                local_19 = 1;
                              }
                              else {
                                bVar1 = equals(this,-2,-1,4,2,0,0,0);
                                if (bVar1) {
                                  std::operator<<(&local_198,'F');
                                  std::operator<<(&local_320,"farad");
                                  local_19 = 1;
                                }
                                else {
                                  bVar1 = equals(this,2,1,-3,-2,0,0,0);
                                  if (bVar1) {
                                    std::operator<<(&local_198,'O');
                                    std::operator<<(&local_320,"ohm");
                                    local_19 = 1;
                                  }
                                  else {
                                    bVar1 = equals(this,-2,-1,3,2,0,0,0);
                                    if (bVar1) {
                                      std::operator<<(&local_198,'S');
                                      std::operator<<(&local_320,"siemens");
                                      local_19 = 1;
                                    }
                                    else {
                                      bVar1 = equals(this,2,1,-2,-1,0,0,0);
                                      if (bVar1) {
                                        std::operator<<(&local_198,"Wb");
                                        std::operator<<(&local_320,"weber");
                                        local_19 = 1;
                                      }
                                      else {
                                        bVar1 = equals(this,0,1,-2,-1,0,0,0);
                                        if (bVar1) {
                                          std::operator<<(&local_198,'T');
                                          std::operator<<(&local_320,"tesla");
                                          local_19 = 1;
                                        }
                                        else {
                                          bVar1 = equals(this,2,1,-2,-1,0,0,0);
                                          if (bVar1) {
                                            std::operator<<(&local_198,'H');
                                            std::operator<<(&local_320,"henry");
                                            local_19 = 1;
                                          }
                                          else {
                                            bVar1 = equals(this,-2,0,0,0,0,0,1);
                                            if (bVar1) {
                                              std::operator<<(&local_198,"lx");
                                              std::operator<<(&local_320,"lux");
                                              local_19 = 1;
                                            }
                                            else {
                                              bVar1 = equals(this,0,0,-1,0,0,1,0);
                                              if (bVar1) {
                                                std::operator<<(&local_198,"kat");
                                                std::operator<<(&local_320,"katal");
                                                local_19 = 1;
                                              }
                                              else {
                                                bVar1 = equals(this,0,0,-1,0,0,0,0);
                                                if (bVar1) {
                                                  std::operator<<(&local_198,"Hz");
                                                  std::operator<<(&local_320,"Hertz");
                                                  local_19 = 1;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)&this->sUnitName,local_360);
    std::__cxx11::string::~string(local_360);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)&this->sUnitSymbol,local_380);
    std::__cxx11::string::~string(local_380);
    this_local._7_1_ = local_19 & 1;
    std::__cxx11::stringstream::~stringstream(local_330);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->sUnitName,"unit unvalid");
    std::__cxx11::string::operator=((string *)&this->sUnitSymbol,"uv");
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Unit::setNamesStandard()
{
	bool match = false;
	
	if (bInvalid) {
		sUnitName = "unit unvalid";
		sUnitSymbol = "uv";
		return true;
	}
	
	stringstream symbol;
	stringstream name;
	
	// the prefix
	switch(nExpPrefix) {
		case -24:
			symbol << 'y'; name << "yocto"; break;
		case -21:
			symbol << 'z'; name << "zepto"; break;
		case -18:
			symbol << 'a'; name << "atto"; break;
		case -15:
			symbol << 'f'; name << "femto"; break;
		case -12:
			symbol << 'p'; name << "pico"; break;
		case -9:
			symbol << 'n'; name << "nano"; break;
		case -6:
			symbol << 'u'; name << "micro"; break;
		case -3:
			symbol << 'm'; name << "milli"; break;
		case -2:
			symbol << 'c'; name << "centi"; break;
		case -1:
			symbol << 'd'; name << "deci"; break;
		case 1:
			symbol << "da"; name << "deca"; break;
		case 0:
			symbol << ""; name << ""; break;
		case 2:
			symbol << 'h'; name << "hecto"; break;
		case 3:
			symbol << 'k'; name << "kilo"; break;
		case 6:
			symbol << 'M'; name << "mega"; break;
		case 9:
			symbol << 'G'; name << "giga"; break;
		case 12:
			symbol << 'T'; name << "tera"; break;
		case 15:
			symbol << 'P'; name << "peta"; break;
		case 18:
			symbol << 'E'; name << "exa"; break;
		case 21:
			symbol << 'Z'; name << "zetta"; break;
		case 24:
			symbol << 'Y'; name << "yotta"; break;
		default:
			symbol << "10^" << nExpPrefix << ' '; break;
	}
/*	sUnitName = name.str();
	sUnitSymbol = symbol.str();
	name.clear();
	symbol.clear();
*/	
	// the basics
	if (equals(0,0,0,0,0,0,0)) {
		symbol << "";
		name << ""; // was "no unit"
		match = true;
	} else if (equals(1,0,0,0,0,0,0)) {
		symbol << "m";
		name << "meter";
		match = true;
	} else if (equals(0,1,0,0,0,0,0)) {
		symbol << "kg";
		name << "kilogram";
		match = true;
	} else if (equals(0,0,1,0,0,0,0)) {
		symbol << "s";
		name << "second";
		match = true;
	} else if (equals(0,0,0,1,0,0,0)) {
		symbol << "A";
		name << "ampere";
		match = true;
	} else if (equals(0,0,0,0,1,0,0)) { 
		symbol << "K";
		name << "kelvin";
		match = true;
	} else if (equals(0,0,0,0,0,1,0)) {
		symbol << "mol";
		name << "mole";
		match = true;
	} else if (equals(0,0,0,0,0,0,1)) {
		symbol << "cd";
		name << "candela";
		match = true;
	}
	
	// special
	else if (equals(1,1,-2,0,0,0,0)) {
		symbol << 'N';
		name << "newton";
		match = true;
	} else if (equals(-1,1,-2,0,0,0,0)) {
		symbol << "Pa";
		name << "pascal";
		match = true;
	} else if (equals(2,1,-2,0,0,0,0)) {
		symbol << 'J';
		name << "joule";
		match = true;
	} else if (equals(2,1,-3,0,0,0,0)) {
		symbol << 'W';
		name << "watt";
		match = true;
	} else if (equals(0,0,1,1,0,0,0)) {
		symbol << 'C';
		name << "coulomb";
		match = true;
	} else if (equals(2,1,-3,-1,0,0,0)) {
		symbol << 'V';
		name << "volt";
		match = true;
	} else if (equals(-2,-1,4,2,0,0,0)) {
		symbol << 'F';
		name << "farad";
		match = true;
	} else if (equals(2,1,-3,-2,0,0,0)) {
		symbol << 'O'; // should we do something like \Omega?
		name << "ohm";
		match = true;
	} else if (equals(-2,-1,3,2,0,0,0)) {
		symbol << 'S';
		name << "siemens";
		match = true;
	} else if (equals(2,1,-2,-1,0,0,0)) {
		symbol << "Wb";
		name << "weber";
		match = true;
	} else if (equals(0,1,-2,-1,0,0,0)) {
		symbol << 'T';
		name << "tesla";
		match = true;
	} else if (equals(2,1,-2,-1,0,0,0)) {
		symbol << 'H';
		name << "henry";
		match = true;
	} else if (equals(-2,0,0,0,0,0,1)) {
		symbol << "lx";
		name << "lux";
		match = true;
	} else if (equals(0,0,-1,0,0,1,0)) {
		symbol << "kat";
		name << "katal";
		match = true;
	} else if (equals(0,0,-1,0,0,0,0)) {
		symbol << "Hz";
		name << "Hertz";
		match = true;
	}
	
	sUnitName = name.str();
	sUnitSymbol = symbol.str();
	return match;
}